

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_pathname_wcs(archive_match *a,wchar_t timetype,wchar_t *path)

{
  wchar_t wVar1;
  size_t len;
  int *piVar2;
  undefined1 auStack_40 [4];
  wchar_t r;
  archive_string as;
  wchar_t *path_local;
  wchar_t timetype_local;
  archive_match *a_local;
  
  as.buffer_length = (size_t)path;
  if ((path == (wchar_t *)0x0) || (*path == L'\0')) {
    archive_set_error(&a->archive,0x16,"pathname is empty");
    a_local._4_4_ = L'\xffffffe7';
  }
  else {
    _auStack_40 = (char *)0x0;
    as.s = (char *)0x0;
    as.length = 0;
    len = wcslen(path);
    wVar1 = archive_string_append_from_wcs((archive_string *)auStack_40,path,len);
    if (wVar1 < L'\0') {
      archive_string_free((archive_string *)auStack_40);
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        a_local._4_4_ = error_nomem(a);
      }
      else {
        archive_set_error(&a->archive,-1,"Failed to convert WCS to MBS");
        a_local._4_4_ = L'\xffffffe7';
      }
    }
    else {
      a_local._4_4_ = set_timefilter_pathname_mbs(a,timetype,_auStack_40);
      archive_string_free((archive_string *)auStack_40);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
set_timefilter_pathname_wcs(struct archive_match *a, int timetype,
    const wchar_t *path)
{
	struct archive_string as;
	int r;

	if (path == NULL || *path == L'\0') {
		archive_set_error(&(a->archive), EINVAL, "pathname is empty");
		return (ARCHIVE_FAILED);
	}

	/* Convert WCS filename to MBS filename. */
	archive_string_init(&as);
	if (archive_string_append_from_wcs(&as, path, wcslen(path)) < 0) {
		archive_string_free(&as);
		if (errno == ENOMEM)
			return (error_nomem(a));
		archive_set_error(&(a->archive), -1,
		    "Failed to convert WCS to MBS");
		return (ARCHIVE_FAILED);
	}

	r = set_timefilter_pathname_mbs(a, timetype, as.s);
	archive_string_free(&as);

	return (r);
}